

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O3

int Nm_ManTableAdd(Nm_Man_t *p,Nm_Entry_t *pEntry)

{
  Nm_Entry_t **ppNVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Nm_Entry_t **ppNVar5;
  Nm_Entry_t **ppNVar6;
  Nm_Entry_t *pNVar7;
  Nm_Entry_t *pNVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  char cVar15;
  timespec ts;
  timespec local_40;
  
  uVar12 = p->nBins;
  if ((int)(p->nSizeFactor * uVar12) < p->nEntries) {
    clock_gettime(3,&local_40);
    uVar4 = p->nBins;
    uVar3 = p->nGrowthFactor * uVar4 - 1;
    while( true ) {
      do {
        uVar12 = uVar3 + 1;
        uVar2 = uVar3 & 1;
        uVar3 = uVar12;
      } while (uVar2 != 0);
      if (uVar12 < 9) break;
      iVar10 = 5;
      while (uVar12 % (iVar10 - 2U) != 0) {
        uVar2 = iVar10 * iVar10;
        iVar10 = iVar10 + 2;
        if (uVar12 < uVar2) goto LAB_004a3a4e;
      }
    }
LAB_004a3a4e:
    ppNVar5 = (Nm_Entry_t **)calloc(1,(long)(int)uVar12 << 3);
    ppNVar6 = (Nm_Entry_t **)calloc(1,(long)(int)uVar12 << 3);
    if ((int)uVar4 < 1) {
      iVar10 = 0;
    }
    else {
      ppNVar1 = p->pBinsI2N;
      uVar13 = 0;
      iVar10 = 0;
      do {
        pNVar7 = ppNVar1[uVar13];
        while (pNVar7 != (Nm_Entry_t *)0x0) {
          pNVar8 = pNVar7->pNextI2N;
          uVar3 = pNVar7->ObjId;
          uVar11 = (ulong)((uVar3 >> 0x18) * 0x161 ^ (uVar3 & 0xff) * 0x1f01 ^
                           (uVar3 >> 8 & 0xff) * 0xb9b ^ (uVar3 >> 0x10 & 0xff) * 0x38f) %
                   (ulong)uVar12;
          pNVar7->pNextI2N = ppNVar5[uVar11];
          ppNVar5[uVar11] = pNVar7;
          iVar10 = iVar10 + 1;
          pNVar7 = pNVar8;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar4);
      ppNVar1 = p->pBinsN2I;
      uVar13 = 0;
      do {
        pNVar7 = ppNVar1[uVar13];
        while (pNVar7 != (Nm_Entry_t *)0x0) {
          cVar15 = (char)pNVar7[1].Type;
          uVar3 = 0;
          if (cVar15 != '\0') {
            uVar11 = 1;
            uVar14 = 0;
            do {
              uVar3 = uVar3 ^ (int)cVar15 * (int)cVar15 *
                              (&Nm_HashString_s_Primes)
                              [(uint)(~((int)(uVar14 / 10) * 10) + (int)uVar11)];
              uVar14 = (ulong)((int)uVar14 + 1);
              cVar15 = *(char *)((long)&pNVar7[1].Type + uVar11);
              uVar11 = (ulong)((int)uVar11 + 1);
            } while (cVar15 != '\0');
          }
          pNVar8 = pNVar7->pNextN2I;
          pNVar7->pNextN2I = ppNVar6[(ulong)uVar3 % (ulong)uVar12];
          ppNVar6[(ulong)uVar3 % (ulong)uVar12] = pNVar7;
          pNVar7 = pNVar8;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar4);
    }
    if (iVar10 != p->nEntries) {
      __assert_fail("Counter == p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x122,"void Nm_ManResize(Nm_Man_t *)");
    }
    if (p->pBinsI2N != (Nm_Entry_t **)0x0) {
      free(p->pBinsI2N);
      p->pBinsI2N = (Nm_Entry_t **)0x0;
    }
    if (p->pBinsN2I != (Nm_Entry_t **)0x0) {
      free(p->pBinsN2I);
    }
    p->pBinsI2N = ppNVar5;
    p->pBinsN2I = ppNVar6;
    p->nBins = uVar12;
  }
  uVar4 = pEntry->ObjId;
  pNVar7 = Nm_ManTableLookupId(p,uVar4);
  if (pNVar7 == (Nm_Entry_t *)0x0) {
    ppNVar5 = p->pBinsI2N;
    uVar3 = 0;
    uVar13 = (ulong)((uVar4 >> 0x18) * 0x161 ^ (uVar4 & 0xff) * 0x1f01 ^ (uVar4 >> 8 & 0xff) * 0xb9b
                    ^ (uVar4 >> 0x10 & 0xff) * 0x38f) % (ulong)uVar12;
    pEntry->pNextI2N = ppNVar5[uVar13];
    ppNVar5[uVar13] = pEntry;
    pNVar7 = pEntry + 1;
    pNVar8 = Nm_ManTableLookupName(p,(char *)pNVar7,-1);
    if (pNVar8 == (Nm_Entry_t *)0x0) {
      cVar15 = (char)pNVar7->Type;
      if (cVar15 != '\0') {
        uVar3 = 0;
        uVar4 = 1;
        uVar2 = 0;
        do {
          uVar3 = uVar3 ^ (int)cVar15 * (int)cVar15 *
                          (&Nm_HashString_s_Primes)[~((uVar2 / 10) * 10) + uVar4];
          uVar2 = uVar2 + 1;
          cVar15 = *(char *)((long)&pNVar7->Type + (ulong)uVar4);
          uVar4 = uVar4 + 1;
        } while (cVar15 != '\0');
      }
      ppNVar5 = p->pBinsN2I + (ulong)uVar3 % (ulong)uVar12;
      pNVar7 = *ppNVar5;
      lVar9 = 0x10;
    }
    else {
      ppNVar5 = &pNVar8->pNameSake;
      pNVar7 = pNVar8->pNameSake;
      if (pNVar8->pNameSake == (Nm_Entry_t *)0x0) {
        pNVar7 = pNVar8;
      }
      lVar9 = 0x18;
    }
    *(Nm_Entry_t **)((long)&pEntry->Type + lVar9) = pNVar7;
    *ppNVar5 = pEntry;
    p->nEntries = p->nEntries + 1;
    return 1;
  }
  __assert_fail("Nm_ManTableLookupId(p, pEntry->ObjId) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                ,0x4e,"int Nm_ManTableAdd(Nm_Man_t *, Nm_Entry_t *)");
}

Assistant:

int Nm_ManTableAdd( Nm_Man_t * p, Nm_Entry_t * pEntry )
{
    Nm_Entry_t ** ppSpot, * pOther;
    // resize the tables if needed
    if ( p->nEntries > p->nBins * p->nSizeFactor )
        Nm_ManResize( p );
    // add the entry to the table Id->Name
    assert( Nm_ManTableLookupId(p, pEntry->ObjId) == NULL );
    ppSpot = p->pBinsI2N + Nm_HashNumber(pEntry->ObjId, p->nBins);
    pEntry->pNextI2N = *ppSpot;
    *ppSpot = pEntry;
    // check if an entry with the same name already exists
    if ( (pOther = Nm_ManTableLookupName(p, pEntry->Name, -1)) )
    {
        // entry with the same name already exists - add it to the ring
        pEntry->pNameSake = pOther->pNameSake? pOther->pNameSake : pOther;
        pOther->pNameSake = pEntry;
    }
    else
    {
        // entry with the same name does not exist - add it to the table
        ppSpot = p->pBinsN2I + Nm_HashString(pEntry->Name, p->nBins);
        pEntry->pNextN2I = *ppSpot;
        *ppSpot = pEntry;
    }
    // report successfully added entry
    p->nEntries++;
    return 1;
}